

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTcpIpConnection.cxx
# Opt level: O2

void __thiscall cmTcpIpConnection::cmTcpIpConnection(cmTcpIpConnection *this,int port)

{
  cmEventBasedConnection::cmEventBasedConnection
            (&this->super_cmEventBasedConnection,(cmConnectionBufferStrategy *)0x0);
  (this->super_cmEventBasedConnection).super_cmConnection._vptr_cmConnection =
       (_func_int **)&PTR_WriteData_006560a0;
  this->Port = port;
  auto_tcp_t::auto_tcp_t(&this->ServerHandle);
  auto_tcp_t::auto_tcp_t(&this->ClientHandle);
  return;
}

Assistant:

cmTcpIpConnection::cmTcpIpConnection(int port)
  : Port(port)
{
}